

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O0

void __thiscall
AomLeb128_FixedSizeEncodeTest_Test::TestBody(AomLeb128_FixedSizeEncodeTest_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  size_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t bytes_written;
  uint8_t write_buffer [4];
  size_t kWriteBufferSize;
  uint8_t expected_bytes [4];
  uint32_t test_value;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int line;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar2;
  char *in_stack_ffffffffffffff38;
  AssertionResult *this_02;
  AssertionResult local_a0;
  ulong local_90;
  Message *in_stack_ffffffffffffff88;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff90;
  AssertionResult local_38;
  size_t local_28;
  uint8_t local_1c [28];
  
  local_1c[0x10] = '#';
  local_1c[0x11] = '\x01';
  local_1c[0x12] = '\0';
  local_1c[0x13] = '\0';
  local_1c[0xc] = 0xa3;
  local_1c[0xd] = 0x82;
  local_1c[0xe] = 0x80;
  local_1c[0xf] = '\0';
  local_1c[4] = '\x04';
  local_1c[5] = '\0';
  local_1c[6] = '\0';
  local_1c[7] = '\0';
  local_1c[8] = '\0';
  local_1c[9] = '\0';
  local_1c[10] = '\0';
  local_1c[0xb] = '\0';
  local_1c[0] = '\0';
  local_1c[1] = '\0';
  local_1c[2] = '\0';
  local_1c[3] = '\0';
  local_28 = 0;
  aom_uleb_encode_fixed_size(0x123,4,4,local_1c,&local_28);
  this_02 = &local_38;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (int *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             (int *)in_stack_ffffffffffffff10);
  line = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_ffffffffffffff38 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3aea20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)in_stack_ffffffffffffff38 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),line,
               in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff90._M_head_impl,in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0x3aea7d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aeae8);
  if (bVar1) {
    this_01 = (AssertionResult *)&stack0xffffffffffffff88;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)this_01,in_stack_ffffffffffffff20,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
               (unsigned_long *)in_stack_ffffffffffffff10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    uVar2 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      in_stack_ffffffffffffff20 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3aeb8d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_02,(Type)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 (char *)CONCAT17(uVar2,in_stack_ffffffffffffff30),(int)((ulong)this_01 >> 0x20),
                 in_stack_ffffffffffffff20);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff90._M_head_impl,in_stack_ffffffffffffff88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
      testing::Message::~Message((Message *)0x3aebdb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aec43);
    if (bVar1) {
      for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
        this_00 = &local_a0;
        testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                  (&this_01->success_,in_stack_ffffffffffffff20,
                   (uchar *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                   &this_00->success_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
        in_stack_ffffffffffffff1f = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)this_02);
          testing::AssertionResult::failure_message((AssertionResult *)0x3aed03);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_02,(Type)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                     (char *)CONCAT17(uVar2,in_stack_ffffffffffffff30),(int)((ulong)this_01 >> 0x20)
                     ,in_stack_ffffffffffffff20);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_ffffffffffffff90._M_head_impl,
                     in_stack_ffffffffffffff88);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::Message::~Message((Message *)0x3aed4f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aedb1);
        if (!bVar1) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

TEST(AomLeb128, FixedSizeEncodeTest) {
  const uint32_t test_value = 0x123;
  const uint8_t expected_bytes[4] = { 0xa3, 0x82, 0x80, 0x00 };
  const size_t kWriteBufferSize = 4;
  uint8_t write_buffer[kWriteBufferSize] = { 0 };
  size_t bytes_written = 0;
  ASSERT_EQ(0, aom_uleb_encode_fixed_size(test_value, kWriteBufferSize,
                                          kWriteBufferSize, &write_buffer[0],
                                          &bytes_written));
  ASSERT_EQ(kWriteBufferSize, bytes_written);
  for (size_t i = 0; i < bytes_written; ++i) {
    ASSERT_EQ(write_buffer[i], expected_bytes[i]);
  }
}